

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdqsort.h
# Opt level: O3

void pdqsort_detail::
     pdqsort_loop<__gnu_cxx::__normal_iterator<HighsCliqueTable::CliqueVar*,std::vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>>,HighsCliqueTable::cliquePartition(std::vector<double,std::allocator<double>>const&,std::vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>&,std::vector<int,std::allocator<int>>&)::__0,true>
               (__normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
                begin,__normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
                      end,anon_class_8_1_bccf3fd9 comp,int bad_allowed,bool leftmost)

{
  __normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
  end_00;
  byte *pbVar1;
  byte *pbVar2;
  byte bVar3;
  char cVar4;
  ulong uVar5;
  CliqueVar CVar6;
  long lVar7;
  pointer pdVar8;
  CliqueVar *pCVar9;
  CliqueVar CVar10;
  ulong uVar11;
  CliqueVar *pCVar12;
  __normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
  _Var13;
  _Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ERGO_Code[P]HiGHS_src_mip_HighsCliqueTable_cpp:1010:22)>
  __cmp;
  uint uVar14;
  ulong uVar15;
  long lVar16;
  ulong uVar17;
  ulong uVar18;
  CliqueVar *pCVar19;
  ulong uVar20;
  ulong uVar21;
  CliqueVar *pCVar22;
  CliqueVar *pCVar23;
  long lVar24;
  long lVar25;
  CliqueVar *pCVar26;
  bool bVar27;
  CliqueVar CVar28;
  double dVar29;
  double dVar30;
  double dVar31;
  _DistanceType __len;
  uchar offsets_l_storage [128];
  CliqueVar *local_1d8;
  int local_1b4;
  byte local_101 [128];
  byte local_81 [81];
  
  lVar7 = (long)end._M_current - (long)begin._M_current;
  uVar11 = lVar7 >> 2;
  local_1b4 = bad_allowed;
  if ((long)uVar11 < 0x18) {
    if (!leftmost) {
LAB_002679ed:
      if (begin._M_current + 1 == end._M_current || begin._M_current == end._M_current) {
        return;
      }
      pdVar8 = ((comp.objective)->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      pCVar12 = begin._M_current + 1;
      do {
        pCVar19 = pCVar12;
        uVar11 = *(ulong *)begin._M_current;
        CVar6 = SUB84(uVar11 >> 0x20,0);
        dVar31 = (double)(int)(((uint)CVar6 >> 0x1e & 2) - 1);
        pCVar12 = pCVar19;
        if (pdVar8[(uint)uVar11 & 0x7fffffff] * (double)(int)(((uint)uVar11 >> 0x1e & 2) - 1) <
            pdVar8[(uint)CVar6 & 0x7fffffff] * dVar31) {
          do {
            pCVar23 = pCVar12;
            *pCVar23 = SUB84(uVar11,0);
            CVar10 = pCVar23[-2];
            uVar11 = (ulong)(uint)CVar10;
            pdVar8 = ((comp.objective)->super__Vector_base<double,_std::allocator<double>_>)._M_impl
                     .super__Vector_impl_data._M_start;
            pCVar12 = pCVar23 + -1;
          } while ((double)(((int)CVar10 >> 0x1f) * -2 + -1) * pdVar8[(uint)CVar10 & 0x7fffffff] <
                   pdVar8[(uint)CVar6 & 0x7fffffff] * dVar31);
          pCVar23[-1] = CVar6;
          pdVar8 = ((comp.objective)->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start;
        }
        pCVar12 = pCVar19 + 1;
        begin._M_current = pCVar19;
      } while (pCVar19 + 1 != end._M_current);
      return;
    }
  }
  else {
    do {
      uVar5 = uVar11 >> 1;
      pdVar8 = ((comp.objective)->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      if (uVar11 < 0x81) {
        CVar6 = *begin._M_current;
        CVar10 = begin._M_current[uVar5];
        uVar20 = (ulong)(uint)CVar6 & 0x7fffffff;
        uVar15 = (ulong)(uint)CVar10 & 0x7fffffff;
        dVar31 = (double)(int)(((uint)CVar6 >> 0x1e & 2) - 1);
        dVar29 = (double)(int)(((uint)CVar10 >> 0x1e & 2) - 1);
        dVar30 = pdVar8[uVar20] * dVar31;
        uVar17 = (ulong)(uint)CVar6;
        if (pdVar8[uVar15] * dVar29 < dVar30) {
          begin._M_current[uVar5] = CVar6;
          *begin._M_current = CVar10;
          pdVar8 = ((comp.objective)->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          dVar30 = dVar29 * pdVar8[uVar15];
          uVar17 = (ulong)(uint)CVar10;
          uVar20 = uVar15;
          dVar31 = dVar29;
        }
        uVar14 = (uint)uVar20;
        CVar6 = end._M_current[-1];
        if (dVar30 < (double)(((int)CVar6 >> 0x1f) * -2 + -1) * pdVar8[(uint)CVar6 & 0x7fffffff]) {
          *begin._M_current = CVar6;
          end._M_current[-1] = SUB84(uVar17,0);
          CVar6 = *begin._M_current;
          uVar17 = (ulong)(uint)CVar6;
          pdVar8 = ((comp.objective)->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          dVar31 = (double)(((int)CVar6 >> 0x1f) * -2 + -1);
          uVar14 = (uint)CVar6 & 0x7fffffff;
        }
        CVar6 = begin._M_current[uVar5];
        if ((double)(((int)CVar6 >> 0x1f) * -2 + -1) * pdVar8[(uint)CVar6 & 0x7fffffff] <
            dVar31 * pdVar8[uVar14]) {
          begin._M_current[uVar5] = SUB84(uVar17,0);
          *begin._M_current = CVar6;
          uVar17 = (ulong)(uint)CVar6;
        }
      }
      else {
        CVar10 = begin._M_current[uVar5];
        CVar6 = *begin._M_current;
        uVar20 = (ulong)(uint)CVar6 & 0x7fffffff;
        dVar31 = (double)(int)(((uint)CVar10 >> 0x1e & 2) - 1);
        dVar29 = (double)(int)(((uint)CVar6 >> 0x1e & 2) - 1);
        dVar30 = pdVar8[(ulong)(uint)CVar10 & 0x7fffffff] * dVar31;
        uVar17 = (ulong)(uint)CVar10 & 0x7fffffff;
        if (pdVar8[uVar20] * dVar29 < dVar30) {
          *begin._M_current = CVar10;
          begin._M_current[uVar5] = CVar6;
          pdVar8 = ((comp.objective)->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          dVar30 = dVar29 * pdVar8[uVar20];
          uVar17 = uVar20;
          dVar31 = dVar29;
          CVar10 = CVar6;
        }
        uVar14 = (uint)uVar17;
        CVar6 = end._M_current[-1];
        if (dVar30 < (double)(((int)CVar6 >> 0x1f) * -2 + -1) * pdVar8[(uint)CVar6 & 0x7fffffff]) {
          begin._M_current[uVar5] = CVar6;
          end._M_current[-1] = CVar10;
          CVar10 = begin._M_current[uVar5];
          pdVar8 = ((comp.objective)->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          dVar31 = (double)(((int)CVar10 >> 0x1f) * -2 + -1);
          uVar14 = (uint)CVar10 & 0x7fffffff;
        }
        CVar6 = *begin._M_current;
        if ((double)(((int)CVar6 >> 0x1f) * -2 + -1) * pdVar8[(uint)CVar6 & 0x7fffffff] <
            dVar31 * pdVar8[uVar14]) {
          *begin._M_current = CVar10;
          begin._M_current[uVar5] = CVar6;
          pdVar8 = ((comp.objective)->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start;
        }
        CVar10 = begin._M_current[uVar5 - 1];
        CVar6 = begin._M_current[1];
        uVar20 = (ulong)(uint)CVar6 & 0x7fffffff;
        dVar31 = (double)(int)(((uint)CVar10 >> 0x1e & 2) - 1);
        dVar29 = (double)(int)(((uint)CVar6 >> 0x1e & 2) - 1);
        dVar30 = pdVar8[(ulong)(uint)CVar10 & 0x7fffffff] * dVar31;
        uVar17 = (ulong)(uint)CVar10 & 0x7fffffff;
        if (pdVar8[uVar20] * dVar29 < dVar30) {
          begin._M_current[1] = CVar10;
          begin._M_current[uVar5 - 1] = CVar6;
          pdVar8 = ((comp.objective)->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          dVar30 = dVar29 * pdVar8[uVar20];
          uVar17 = uVar20;
          dVar31 = dVar29;
          CVar10 = CVar6;
        }
        uVar14 = (uint)uVar17;
        CVar6 = end._M_current[-2];
        if (dVar30 < (double)(((int)CVar6 >> 0x1f) * -2 + -1) * pdVar8[(uint)CVar6 & 0x7fffffff]) {
          begin._M_current[uVar5 - 1] = CVar6;
          end._M_current[-2] = CVar10;
          CVar10 = begin._M_current[uVar5 - 1];
          pdVar8 = ((comp.objective)->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          dVar31 = (double)(((int)CVar10 >> 0x1f) * -2 + -1);
          uVar14 = (uint)CVar10 & 0x7fffffff;
        }
        CVar6 = begin._M_current[1];
        if ((double)(((int)CVar6 >> 0x1f) * -2 + -1) * pdVar8[(uint)CVar6 & 0x7fffffff] <
            dVar31 * pdVar8[uVar14]) {
          begin._M_current[1] = CVar10;
          begin._M_current[uVar5 - 1] = CVar6;
          pdVar8 = ((comp.objective)->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start;
        }
        CVar10 = begin._M_current[uVar5 + 1];
        CVar6 = begin._M_current[2];
        uVar20 = (ulong)(uint)CVar6 & 0x7fffffff;
        dVar31 = (double)(int)(((uint)CVar10 >> 0x1e & 2) - 1);
        dVar29 = (double)(int)(((uint)CVar6 >> 0x1e & 2) - 1);
        dVar30 = pdVar8[(ulong)(uint)CVar10 & 0x7fffffff] * dVar31;
        uVar17 = (ulong)(uint)CVar10 & 0x7fffffff;
        if (pdVar8[uVar20] * dVar29 < dVar30) {
          begin._M_current[2] = CVar10;
          begin._M_current[uVar5 + 1] = CVar6;
          pdVar8 = ((comp.objective)->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          dVar30 = dVar29 * pdVar8[uVar20];
          uVar17 = uVar20;
          dVar31 = dVar29;
          CVar10 = CVar6;
        }
        uVar14 = (uint)uVar17;
        CVar6 = end._M_current[-3];
        if (dVar30 < (double)(((int)CVar6 >> 0x1f) * -2 + -1) * pdVar8[(uint)CVar6 & 0x7fffffff]) {
          begin._M_current[uVar5 + 1] = CVar6;
          end._M_current[-3] = CVar10;
          CVar10 = begin._M_current[uVar5 + 1];
          pdVar8 = ((comp.objective)->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          dVar31 = (double)(((int)CVar10 >> 0x1f) * -2 + -1);
          uVar14 = (uint)CVar10 & 0x7fffffff;
        }
        CVar6 = begin._M_current[2];
        if ((double)(((int)CVar6 >> 0x1f) * -2 + -1) * pdVar8[(uint)CVar6 & 0x7fffffff] <
            dVar31 * pdVar8[uVar14]) {
          begin._M_current[2] = CVar10;
          begin._M_current[uVar5 + 1] = CVar6;
          pdVar8 = ((comp.objective)->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          CVar10 = CVar6;
        }
        uVar17 = *(ulong *)(begin._M_current + (uVar5 - 1));
        CVar6 = SUB84(uVar17 >> 0x20,0);
        uVar20 = (ulong)((uint)CVar6 & 0x7fffffff);
        CVar28 = SUB84(uVar17,0);
        dVar29 = (double)(int)(((uint)CVar28 >> 0x1e & 2) - 1);
        dVar31 = (double)(int)(((uint)CVar6 >> 0x1e & 2) - 1);
        uVar15 = (ulong)((uint)CVar28 & 0x7fffffff);
        dVar30 = pdVar8[uVar20] * dVar31;
        if (pdVar8[uVar15] * dVar29 < dVar30) {
          begin._M_current[uVar5 - 1] = CVar6;
          begin._M_current[uVar5] = CVar28;
          pdVar8 = ((comp.objective)->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          dVar30 = dVar29 * pdVar8[uVar15];
          uVar20 = uVar15;
          dVar31 = dVar29;
          uVar17 = uVar17 >> 0x20;
          CVar6 = CVar28;
        }
        CVar28 = SUB84(uVar17,0);
        dVar29 = (double)(((int)CVar10 >> 0x1f) * -2 + -1);
        if (dVar30 < pdVar8[(uint)CVar10 & 0x7fffffff] * dVar29) {
          begin._M_current[uVar5] = CVar10;
          begin._M_current[uVar5 + 1] = CVar6;
          pdVar8 = ((comp.objective)->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          uVar20 = (ulong)((uint)CVar10 & 0x7fffffff);
          dVar31 = dVar29;
          CVar6 = CVar10;
        }
        if ((double)((int)((uVar17 & 0xffffffff) >> 0x1f) * 2 + -1) *
            pdVar8[(uint)CVar28 & 0x7fffffff] < dVar31 * pdVar8[uVar20]) {
          begin._M_current[uVar5 - 1] = CVar6;
          begin._M_current[uVar5] = CVar28;
          CVar6 = CVar28;
        }
        CVar10 = *begin._M_current;
        *begin._M_current = CVar6;
        begin._M_current[uVar5] = CVar10;
        uVar17 = (ulong)(uint)*begin._M_current;
      }
      pdVar8 = ((comp.objective)->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      CVar6 = SUB84(uVar17,0);
      if ((leftmost & 1U) == 0) {
        uVar5 = (ulong)((uint)CVar6 & 0x7fffffff);
        dVar31 = (double)(int)(((uint)CVar6 >> 0x1e & 2) - 1);
        dVar29 = pdVar8[uVar5] * dVar31;
        if (dVar29 < pdVar8[(uint)begin._M_current[-1] & 0x7fffffff] *
                     (double)(int)(((uint)begin._M_current[-1] >> 0x1e & 2) - 1)) goto LAB_00266bae;
        lVar7 = 0;
        do {
          lVar24 = lVar7;
          CVar10 = *(CliqueVar *)(&end._M_current[-1].field_0x0 + lVar24);
          lVar7 = lVar24 + -4;
        } while ((double)(((int)CVar10 >> 0x1f) * -2 + -1) * pdVar8[(uint)CVar10 & 0x7fffffff] <
                 dVar29);
        pCVar12 = (CliqueVar *)(&end._M_current[-1].field_0x0 + lVar24);
        _Var13._M_current = begin._M_current;
        CVar28 = CVar6;
        if (lVar24 + -4 == -4) {
          do {
            if (pCVar12 <= _Var13._M_current) break;
            _Var13._M_current = _Var13._M_current + 1;
            CVar28 = *_Var13._M_current;
          } while (dVar29 <= (double)(((int)CVar28 >> 0x1f) * -2 + -1) *
                             pdVar8[(uint)CVar28 & 0x7fffffff]);
        }
        else {
          do {
            CVar28 = _Var13._M_current[1];
            _Var13._M_current = _Var13._M_current + 1;
          } while (dVar29 <= (double)(((int)CVar28 >> 0x1f) * -2 + -1) *
                             pdVar8[(uint)CVar28 & 0x7fffffff]);
        }
        while (_Var13._M_current < pCVar12) {
          *_Var13._M_current = CVar10;
          *pCVar12 = CVar28;
          pdVar8 = ((comp.objective)->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          do {
            CVar10 = pCVar12[-1];
            pCVar12 = pCVar12 + -1;
          } while ((double)(((int)CVar10 >> 0x1f) * -2 + -1) * pdVar8[(uint)CVar10 & 0x7fffffff] <
                   pdVar8[uVar5] * dVar31);
          do {
            CVar28 = _Var13._M_current[1];
            _Var13._M_current = _Var13._M_current + 1;
          } while (pdVar8[uVar5] * dVar31 <=
                   (double)(((int)CVar28 >> 0x1f) * -2 + -1) * pdVar8[(uint)CVar28 & 0x7fffffff]);
        }
        *begin._M_current = CVar10;
        *pCVar12 = CVar6;
        begin._M_current = pCVar12 + 1;
        lVar24 = (long)end._M_current - (long)begin._M_current;
        uVar11 = lVar24 >> 2;
      }
      else {
        dVar31 = (double)((int)(uVar17 >> 0x1f) * 2 + -1);
        uVar5 = (ulong)((uint)CVar6 & 0x7fffffff);
LAB_00266bae:
        dVar29 = pdVar8[uVar5] * dVar31;
        lVar24 = 0;
        do {
          lVar25 = lVar24;
          CVar10 = *(CliqueVar *)(&begin._M_current[1].field_0x0 + lVar25);
          lVar24 = lVar25 + 4;
        } while (dVar29 < (double)(((int)CVar10 >> 0x1f) * -2 + -1) *
                          pdVar8[(uint)CVar10 & 0x7fffffff]);
        pCVar12 = (CliqueVar *)(&begin._M_current[1].field_0x0 + lVar25);
        _Var13._M_current = end._M_current;
        if (lVar25 + 4 == 4) {
          do {
            if (_Var13._M_current <= pCVar12) break;
            pCVar19 = _Var13._M_current + -1;
            _Var13._M_current = _Var13._M_current + -1;
          } while ((double)(((int)*pCVar19 >> 0x1f) * -2 + -1) * pdVar8[(uint)*pCVar19 & 0x7fffffff]
                   <= dVar29);
        }
        else {
          do {
            pCVar19 = _Var13._M_current + -1;
            _Var13._M_current = _Var13._M_current + -1;
          } while ((double)(((int)*pCVar19 >> 0x1f) * -2 + -1) * pdVar8[(uint)*pCVar19 & 0x7fffffff]
                   <= dVar29);
        }
        pCVar19 = pCVar12;
        if (pCVar12 < _Var13._M_current) {
          pCVar19 = (CliqueVar *)(&begin._M_current[1].field_0x0 + lVar25) + 1;
          *(CliqueVar *)(&begin._M_current[1].field_0x0 + lVar25) = *_Var13._M_current;
          *_Var13._M_current = CVar10;
          if (pCVar19 < _Var13._M_current) {
            lVar25 = 0;
            uVar17 = 0;
            lVar24 = 0;
            uVar20 = 0;
            pCVar22 = _Var13._M_current;
            pCVar23 = _Var13._M_current;
            local_1d8 = pCVar19;
            do {
              uVar21 = uVar20;
              lVar16 = lVar24;
              uVar15 = uVar17;
              uVar20 = (long)pCVar23 - (long)pCVar19 >> 2;
              uVar17 = uVar20 >> (uVar21 == 0);
              if (uVar15 != 0) {
                uVar17 = 0;
              }
              uVar20 = uVar20 - uVar17;
              if (uVar21 != 0) {
                uVar20 = 0;
              }
              if (uVar17 < 0x40) {
                if (uVar17 != 0) {
                  uVar18 = 0;
                  do {
                    local_81[uVar15 + 1] = (byte)uVar18;
                    pdVar8 = ((comp.objective)->super__Vector_base<double,_std::allocator<double>_>)
                             ._M_impl.super__Vector_impl_data._M_start;
                    uVar18 = uVar18 + 1;
                    uVar15 = uVar15 + ((double)(((int)*pCVar19 >> 0x1f) * -2 + -1) *
                                       pdVar8[(uint)*pCVar19 & 0x7fffffff] <= pdVar8[uVar5] * dVar31
                                      );
                    pCVar19 = pCVar19 + 1;
                  } while (uVar17 != uVar18);
                }
              }
              else {
                pCVar26 = pCVar19;
                uVar17 = 0xfffffffffffffff8;
                do {
                  pCVar9 = pCVar26;
                  uVar18 = uVar17 + 8;
                  local_81[uVar15 + 1] = (byte)uVar18;
                  pdVar8 = ((comp.objective)->super__Vector_base<double,_std::allocator<double>_>).
                           _M_impl.super__Vector_impl_data._M_start;
                  lVar24 = ((double)(((int)pCVar19[uVar17 + 8] >> 0x1f) * -2 + -1) *
                            pdVar8[(ulong)(uint)pCVar19[uVar17 + 8] & 0x7fffffff] <=
                           pdVar8[uVar5] * dVar31) + uVar15;
                  cVar4 = (char)uVar17;
                  local_81[lVar24 + 1] = cVar4 + 9;
                  pdVar8 = ((comp.objective)->super__Vector_base<double,_std::allocator<double>_>).
                           _M_impl.super__Vector_impl_data._M_start;
                  lVar24 = (ulong)((double)(((int)pCVar19[uVar17 + 9] >> 0x1f) * -2 + -1) *
                                   pdVar8[(ulong)(uint)pCVar19[uVar17 + 9] & 0x7fffffff] <=
                                  pdVar8[uVar5] * dVar31) + lVar24;
                  local_81[lVar24 + 1] = cVar4 + 10;
                  pdVar8 = ((comp.objective)->super__Vector_base<double,_std::allocator<double>_>).
                           _M_impl.super__Vector_impl_data._M_start;
                  lVar24 = (ulong)((double)(((int)pCVar19[uVar17 + 10] >> 0x1f) * -2 + -1) *
                                   pdVar8[(ulong)(uint)pCVar19[uVar17 + 10] & 0x7fffffff] <=
                                  pdVar8[uVar5] * dVar31) + lVar24;
                  local_81[lVar24 + 1] = cVar4 + 0xb;
                  pdVar8 = ((comp.objective)->super__Vector_base<double,_std::allocator<double>_>).
                           _M_impl.super__Vector_impl_data._M_start;
                  lVar24 = (ulong)((double)(((int)pCVar19[uVar17 + 0xb] >> 0x1f) * -2 + -1) *
                                   pdVar8[(ulong)(uint)pCVar19[uVar17 + 0xb] & 0x7fffffff] <=
                                  pdVar8[uVar5] * dVar31) + lVar24;
                  local_81[lVar24 + 1] = cVar4 + 0xc;
                  pdVar8 = ((comp.objective)->super__Vector_base<double,_std::allocator<double>_>).
                           _M_impl.super__Vector_impl_data._M_start;
                  lVar24 = (ulong)((double)(((int)pCVar19[uVar17 + 0xc] >> 0x1f) * -2 + -1) *
                                   pdVar8[(ulong)(uint)pCVar19[uVar17 + 0xc] & 0x7fffffff] <=
                                  pdVar8[uVar5] * dVar31) + lVar24;
                  local_81[lVar24 + 1] = cVar4 + 0xd;
                  pdVar8 = ((comp.objective)->super__Vector_base<double,_std::allocator<double>_>).
                           _M_impl.super__Vector_impl_data._M_start;
                  lVar24 = (ulong)((double)(((int)pCVar19[uVar17 + 0xd] >> 0x1f) * -2 + -1) *
                                   pdVar8[(ulong)(uint)pCVar19[uVar17 + 0xd] & 0x7fffffff] <=
                                  pdVar8[uVar5] * dVar31) + lVar24;
                  local_81[lVar24 + 1] = cVar4 + 0xe;
                  pdVar8 = ((comp.objective)->super__Vector_base<double,_std::allocator<double>_>).
                           _M_impl.super__Vector_impl_data._M_start;
                  lVar24 = (ulong)((double)(((int)pCVar19[uVar17 + 0xe] >> 0x1f) * -2 + -1) *
                                   pdVar8[(ulong)(uint)pCVar19[uVar17 + 0xe] & 0x7fffffff] <=
                                  pdVar8[uVar5] * dVar31) + lVar24;
                  local_81[lVar24 + 1] = cVar4 + 0xf;
                  pdVar8 = ((comp.objective)->super__Vector_base<double,_std::allocator<double>_>).
                           _M_impl.super__Vector_impl_data._M_start;
                  uVar15 = (ulong)((double)(((int)pCVar19[uVar17 + 0xf] >> 0x1f) * -2 + -1) *
                                   pdVar8[(ulong)(uint)pCVar19[uVar17 + 0xf] & 0x7fffffff] <=
                                  pdVar8[uVar5] * dVar31) + lVar24;
                  pCVar26 = pCVar19 + uVar17 + 0x10;
                  uVar17 = uVar18;
                } while (uVar18 < 0x38);
                pCVar19 = pCVar9 + 8;
              }
              if (uVar20 < 0x40) {
                if (uVar20 != 0) {
                  uVar17 = 0;
                  do {
                    uVar17 = uVar17 + 1;
                    local_101[uVar21 + 1] = (byte)uVar17;
                    pCVar26 = pCVar23 + -1;
                    pCVar23 = pCVar23 + -1;
                    pdVar8 = ((comp.objective)->super__Vector_base<double,_std::allocator<double>_>)
                             ._M_impl.super__Vector_impl_data._M_start;
                    uVar21 = uVar21 + (pdVar8[uVar5] * dVar31 <
                                      (double)(((int)*pCVar26 >> 0x1f) * -2 + -1) *
                                      pdVar8[(uint)*pCVar26 & 0x7fffffff]);
                  } while (uVar20 != uVar17);
                }
              }
              else {
                uVar17 = 0xfffffffffffffff8;
                do {
                  cVar4 = (char)uVar17;
                  local_101[uVar21 + 1] = cVar4 + 9;
                  pdVar8 = ((comp.objective)->super__Vector_base<double,_std::allocator<double>_>).
                           _M_impl.super__Vector_impl_data._M_start;
                  lVar24 = (pdVar8[uVar5] * dVar31 <
                           (double)(((int)pCVar23[-1] >> 0x1f) * -2 + -1) *
                           pdVar8[(ulong)(uint)pCVar23[-1] & 0x7fffffff]) + uVar21;
                  local_101[lVar24 + 1] = cVar4 + 10;
                  pdVar8 = ((comp.objective)->super__Vector_base<double,_std::allocator<double>_>).
                           _M_impl.super__Vector_impl_data._M_start;
                  lVar24 = (ulong)(pdVar8[uVar5] * dVar31 <
                                  (double)(((int)pCVar23[-2] >> 0x1f) * -2 + -1) *
                                  pdVar8[(ulong)(uint)pCVar23[-2] & 0x7fffffff]) + lVar24;
                  local_101[lVar24 + 1] = cVar4 + 0xb;
                  pdVar8 = ((comp.objective)->super__Vector_base<double,_std::allocator<double>_>).
                           _M_impl.super__Vector_impl_data._M_start;
                  lVar24 = (ulong)(pdVar8[uVar5] * dVar31 <
                                  (double)(((int)pCVar23[-3] >> 0x1f) * -2 + -1) *
                                  pdVar8[(ulong)(uint)pCVar23[-3] & 0x7fffffff]) + lVar24;
                  local_101[lVar24 + 1] = cVar4 + 0xc;
                  pdVar8 = ((comp.objective)->super__Vector_base<double,_std::allocator<double>_>).
                           _M_impl.super__Vector_impl_data._M_start;
                  lVar24 = (ulong)(pdVar8[uVar5] * dVar31 <
                                  (double)(((int)pCVar23[-4] >> 0x1f) * -2 + -1) *
                                  pdVar8[(ulong)(uint)pCVar23[-4] & 0x7fffffff]) + lVar24;
                  local_101[lVar24 + 1] = cVar4 + 0xd;
                  pdVar8 = ((comp.objective)->super__Vector_base<double,_std::allocator<double>_>).
                           _M_impl.super__Vector_impl_data._M_start;
                  lVar24 = (ulong)(pdVar8[uVar5] * dVar31 <
                                  (double)(((int)pCVar23[-5] >> 0x1f) * -2 + -1) *
                                  pdVar8[(ulong)(uint)pCVar23[-5] & 0x7fffffff]) + lVar24;
                  local_101[lVar24 + 1] = cVar4 + 0xe;
                  pdVar8 = ((comp.objective)->super__Vector_base<double,_std::allocator<double>_>).
                           _M_impl.super__Vector_impl_data._M_start;
                  lVar24 = (ulong)(pdVar8[uVar5] * dVar31 <
                                  (double)(((int)pCVar23[-6] >> 0x1f) * -2 + -1) *
                                  pdVar8[(ulong)(uint)pCVar23[-6] & 0x7fffffff]) + lVar24;
                  local_101[lVar24 + 1] = cVar4 + 0xf;
                  pdVar8 = ((comp.objective)->super__Vector_base<double,_std::allocator<double>_>).
                           _M_impl.super__Vector_impl_data._M_start;
                  lVar24 = (ulong)(pdVar8[uVar5] * dVar31 <
                                  (double)(((int)pCVar23[-7] >> 0x1f) * -2 + -1) *
                                  pdVar8[(ulong)(uint)pCVar23[-7] & 0x7fffffff]) + lVar24;
                  local_101[lVar24 + 1] = cVar4 + 0x10;
                  pCVar26 = pCVar23 + -8;
                  pdVar8 = ((comp.objective)->super__Vector_base<double,_std::allocator<double>_>).
                           _M_impl.super__Vector_impl_data._M_start;
                  pCVar23 = pCVar23 + -8;
                  uVar21 = (ulong)(pdVar8[uVar5] * dVar31 <
                                  (double)(((int)*pCVar26 >> 0x1f) * -2 + -1) *
                                  pdVar8[(ulong)(uint)*pCVar26 & 0x7fffffff]) + lVar24;
                  uVar17 = uVar17 + 8;
                } while (uVar17 < 0x38);
              }
              uVar18 = uVar15;
              if (uVar21 < uVar15) {
                uVar18 = uVar21;
              }
              pbVar1 = local_81 + lVar25 + 1;
              pbVar2 = local_101 + lVar16 + 1;
              if (uVar15 == uVar21) {
                if (uVar18 != 0) {
                  uVar17 = 0;
                  do {
                    bVar3 = pbVar2[uVar17];
                    CVar10 = local_1d8[pbVar1[uVar17]];
                    local_1d8[pbVar1[uVar17]] = pCVar22[-(ulong)bVar3];
                    pCVar22[-(ulong)bVar3] = CVar10;
                    uVar17 = uVar17 + 1;
                  } while (uVar18 != uVar17);
                }
              }
              else if (uVar18 != 0) {
                pCVar26 = pCVar22 + -(ulong)*pbVar2;
                CVar10 = local_1d8[*pbVar1];
                local_1d8[*pbVar1] = *pCVar26;
                if (uVar18 != 1) {
                  uVar17 = 1;
                  do {
                    bVar3 = pbVar1[uVar17];
                    *pCVar26 = local_1d8[bVar3];
                    pCVar26 = pCVar22 + -(ulong)pbVar2[uVar17];
                    local_1d8[bVar3] = *pCVar26;
                    uVar17 = uVar17 + 1;
                  } while (uVar18 != uVar17);
                }
                *pCVar26 = CVar10;
              }
              uVar17 = uVar15 - uVar18;
              lVar25 = lVar25 + uVar18;
              if (uVar15 <= uVar21) {
                lVar25 = 0;
                local_1d8 = pCVar19;
              }
              uVar20 = uVar21 - uVar18;
              if (uVar20 == 0) {
                pCVar22 = pCVar23;
              }
              lVar24 = uVar18 + lVar16;
              if (uVar20 == 0) {
                lVar24 = 0;
              }
            } while (pCVar19 < pCVar23);
            for (; uVar17 != 0; uVar17 = uVar17 - 1) {
              pCVar19 = (CliqueVar *)((long)pCVar23 + 0xfffffffffffffffc);
              CVar10 = local_1d8[local_81[uVar17 + lVar25]];
              local_1d8[local_81[uVar17 + lVar25]] =
                   *(CliqueVar *)((long)pCVar23 + 0xfffffffffffffffc);
              *(CliqueVar *)((long)pCVar23 + 0xfffffffffffffffc) = CVar10;
              pCVar23 = pCVar19;
            }
            if (uVar20 != 0) {
              if (uVar21 <= uVar15) {
                uVar15 = uVar21;
              }
              do {
                CVar10 = pCVar22[-(ulong)local_101[uVar21 + lVar16]];
                pCVar22[-(ulong)local_101[uVar21 + lVar16]] = *pCVar19;
                *pCVar19 = CVar10;
                pCVar19 = pCVar19 + 1;
                uVar21 = uVar21 - 1;
              } while (uVar15 != uVar21);
            }
          }
        }
        end_00._M_current = pCVar19 + -1;
        *begin._M_current = pCVar19[-1];
        pCVar19[-1] = CVar6;
        uVar5 = (long)end_00._M_current - (long)begin._M_current >> 2;
        lVar24 = (long)end._M_current - (long)pCVar19;
        uVar17 = lVar24 >> 2;
        if (((long)uVar5 < (long)(uVar11 >> 3)) || ((long)uVar17 < (long)(uVar11 >> 3))) {
          local_1b4 = local_1b4 + -1;
          if (local_1b4 == 0) {
            uVar5 = uVar11 - 2 >> 1;
            do {
              std::
              __adjust_heap<__gnu_cxx::__normal_iterator<HighsCliqueTable::CliqueVar*,std::vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>>,long,HighsCliqueTable::CliqueVar,__gnu_cxx::__ops::_Iter_comp_iter<HighsCliqueTable::cliquePartition(std::vector<double,std::allocator<double>>const&,std::vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>&,std::vector<int,std::allocator<int>>&)::__0>>
                        (begin,uVar5,uVar11,begin._M_current[uVar5],
                         (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ERGO_Code[P]HiGHS_src_mip_HighsCliqueTable_cpp:1010:22)>
                          )comp.objective);
              bVar27 = uVar5 != 0;
              uVar5 = uVar5 - 1;
            } while (bVar27);
            if (lVar7 < 5) {
              return;
            }
            lVar7 = (long)end._M_current - (long)begin._M_current;
            do {
              end._M_current = end._M_current + -1;
              CVar6 = *end._M_current;
              *end._M_current = *begin._M_current;
              lVar7 = lVar7 + -4;
              std::
              __adjust_heap<__gnu_cxx::__normal_iterator<HighsCliqueTable::CliqueVar*,std::vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>>,long,HighsCliqueTable::CliqueVar,__gnu_cxx::__ops::_Iter_comp_iter<HighsCliqueTable::cliquePartition(std::vector<double,std::allocator<double>>const&,std::vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>&,std::vector<int,std::allocator<int>>&)::__0>>
                        (begin,0,lVar7 >> 2,CVar6,
                         (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ERGO_Code[P]HiGHS_src_mip_HighsCliqueTable_cpp:1010:22)>
                          )comp.objective);
            } while (4 < lVar7);
            return;
          }
          if (0x17 < (long)uVar5) {
            CVar6 = *begin._M_current;
            uVar11 = uVar5 & 0xfffffffffffffffc;
            *begin._M_current = *(CliqueVar *)(&(begin._M_current)->field_0x0 + uVar11);
            *(CliqueVar *)(&(begin._M_current)->field_0x0 + uVar11) = CVar6;
            CVar6 = pCVar19[-2];
            pCVar19[-2] = *(CliqueVar *)((long)pCVar19 + (-4 - uVar11));
            *(CliqueVar *)((long)pCVar19 + (-4 - uVar11)) = CVar6;
            if (0x80 < uVar5) {
              uVar5 = uVar5 >> 2;
              CVar6 = begin._M_current[1];
              begin._M_current[1] = begin._M_current[uVar5 + 1];
              begin._M_current[uVar5 + 1] = CVar6;
              CVar6 = begin._M_current[2];
              begin._M_current[2] = begin._M_current[uVar5 + 2];
              begin._M_current[uVar5 + 2] = CVar6;
              CVar6 = pCVar19[-3];
              pCVar19[-3] = pCVar19[~uVar5 - 1];
              pCVar19[~uVar5 - 1] = CVar6;
              CVar6 = pCVar19[-4];
              pCVar19[-4] = pCVar19[-uVar5 + -3];
              pCVar19[-uVar5 + -3] = CVar6;
            }
          }
          if (0x17 < (long)uVar17) {
            uVar11 = uVar17 & 0xfffffffffffffffc;
            CVar6 = *pCVar19;
            *pCVar19 = *(CliqueVar *)((long)&pCVar19->field_0x0 + uVar11);
            *(CliqueVar *)((long)&pCVar19->field_0x0 + uVar11) = CVar6;
            CVar6 = end._M_current[-1];
            end._M_current[-1] = *(end._M_current - uVar11);
            *(end._M_current - uVar11) = CVar6;
            if (0x80 < uVar17) {
              uVar11 = uVar17 >> 2;
              CVar6 = pCVar19[1];
              pCVar19[1] = pCVar19[uVar11 + 1];
              pCVar19[uVar11 + 1] = CVar6;
              CVar6 = pCVar19[2];
              pCVar19[2] = pCVar19[uVar11 + 2];
              pCVar19[uVar11 + 2] = CVar6;
              CVar6 = end._M_current[-2];
              end._M_current[-2] = end._M_current[~uVar11];
              end._M_current[~uVar11] = CVar6;
              CVar6 = end._M_current[-3];
              end._M_current[-3] = end._M_current[-2 - uVar11];
              end._M_current[-2 - uVar11] = CVar6;
            }
          }
        }
        else if (_Var13._M_current <= pCVar12) {
          if (begin._M_current + 1 != end_00._M_current && begin._M_current != end_00._M_current) {
            pdVar8 = ((comp.objective)->super__Vector_base<double,_std::allocator<double>_>)._M_impl
                     .super__Vector_impl_data._M_start;
            lVar7 = 4;
            uVar11 = 0;
            _Var13._M_current = begin._M_current;
            pCVar12 = begin._M_current + 1;
            do {
              uVar5 = *(ulong *)_Var13._M_current;
              CVar6 = SUB84(uVar5 >> 0x20,0);
              dVar31 = (double)(int)(((uint)CVar6 >> 0x1e & 2) - 1);
              lVar25 = lVar7;
              if (pdVar8[(uint)uVar5 & 0x7fffffff] * (double)(int)(((uint)uVar5 >> 0x1e & 2) - 1) <
                  pdVar8[(uint)CVar6 & 0x7fffffff] * dVar31) {
                do {
                  lVar16 = lVar25;
                  *(int *)(&(begin._M_current)->field_0x0 + lVar16) = (int)uVar5;
                  _Var13._M_current = begin._M_current;
                  if (lVar16 == 4) goto LAB_002676eb;
                  uVar14 = *(uint *)(&begin._M_current[-2].field_0x0 + lVar16);
                  uVar5 = (ulong)uVar14;
                  pdVar8 = ((comp.objective)->super__Vector_base<double,_std::allocator<double>_>).
                           _M_impl.super__Vector_impl_data._M_start;
                  lVar25 = lVar16 + -4;
                } while ((double)(((int)uVar14 >> 0x1f) * -2 + -1) * pdVar8[uVar14 & 0x7fffffff] <
                         pdVar8[(uint)CVar6 & 0x7fffffff] * dVar31);
                _Var13._M_current = (CliqueVar *)(&begin._M_current[-1].field_0x0 + lVar16);
LAB_002676eb:
                *_Var13._M_current = CVar6;
                uVar11 = ((long)pCVar12 - (long)_Var13._M_current >> 2) + uVar11;
                if (8 < uVar11) goto LAB_00267987;
                pdVar8 = ((comp.objective)->super__Vector_base<double,_std::allocator<double>_>).
                         _M_impl.super__Vector_impl_data._M_start;
              }
              pCVar23 = pCVar12 + 1;
              lVar7 = lVar7 + 4;
              _Var13._M_current = pCVar12;
              pCVar12 = pCVar23;
            } while (pCVar23 != end_00._M_current);
          }
          if (pCVar19 == end._M_current) {
            return;
          }
          pCVar12 = pCVar19 + 1;
          if (pCVar12 == end._M_current) {
            return;
          }
          pdVar8 = ((comp.objective)->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          lVar7 = 0;
          uVar11 = 0;
          pCVar23 = pCVar12;
          pCVar22 = pCVar19;
          do {
            pCVar26 = pCVar23;
            uVar5 = *(ulong *)pCVar22;
            CVar6 = SUB84(uVar5 >> 0x20,0);
            dVar31 = (double)(int)(((uint)CVar6 >> 0x1e & 2) - 1);
            lVar25 = lVar7;
            if (pdVar8[(uint)uVar5 & 0x7fffffff] * (double)(int)(((uint)uVar5 >> 0x1e & 2) - 1) <
                pdVar8[(uint)CVar6 & 0x7fffffff] * dVar31) {
              do {
                lVar16 = lVar25;
                *(int *)((long)&pCVar19[1].field_0x0 + lVar16) = (int)uVar5;
                pCVar23 = pCVar19;
                pCVar22 = pCVar19;
                if (lVar16 == 0) goto LAB_00267812;
                uVar14 = *(uint *)((long)&pCVar19[-1].field_0x0 + lVar16);
                uVar5 = (ulong)uVar14;
                pdVar8 = ((comp.objective)->super__Vector_base<double,_std::allocator<double>_>).
                         _M_impl.super__Vector_impl_data._M_start;
                lVar25 = lVar16 + -4;
              } while ((double)(((int)uVar14 >> 0x1f) * -2 + -1) * pdVar8[uVar14 & 0x7fffffff] <
                       pdVar8[(uint)CVar6 & 0x7fffffff] * dVar31);
              pCVar23 = (CliqueVar *)((long)&pCVar19->field_0x0 + lVar16);
              pCVar22 = (CliqueVar *)((long)&pCVar12[-1].field_0x0 + lVar16);
LAB_00267812:
              *pCVar22 = CVar6;
              uVar11 = ((long)pCVar26 - (long)pCVar23 >> 2) + uVar11;
              if (8 < uVar11) break;
              pdVar8 = ((comp.objective)->super__Vector_base<double,_std::allocator<double>_>).
                       _M_impl.super__Vector_impl_data._M_start;
            }
            lVar7 = lVar7 + 4;
            pCVar23 = pCVar26 + 1;
            pCVar22 = pCVar26;
            if (pCVar26 + 1 == end._M_current) {
              return;
            }
          } while( true );
        }
LAB_00267987:
        pdqsort_loop<__gnu_cxx::__normal_iterator<HighsCliqueTable::CliqueVar*,std::vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>>,HighsCliqueTable::cliquePartition(std::vector<double,std::allocator<double>>const&,std::vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>&,std::vector<int,std::allocator<int>>&)::__0,true>
                  (begin,end_00,comp,local_1b4,(bool)(leftmost & 1));
        leftmost = false;
        uVar11 = uVar17;
        begin._M_current = pCVar19;
      }
      lVar7 = lVar24;
    } while (0x17 < (long)uVar11);
    if ((leftmost & 1U) == 0) goto LAB_002679ed;
  }
  if (begin._M_current + 1 != end._M_current && begin._M_current != end._M_current) {
    pdVar8 = ((comp.objective)->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    lVar7 = 4;
    pCVar12 = begin._M_current;
    pCVar19 = begin._M_current + 1;
    do {
      uVar11 = *(ulong *)pCVar12;
      CVar6 = SUB84(uVar11 >> 0x20,0);
      dVar31 = (double)(int)(((uint)CVar6 >> 0x1e & 2) - 1);
      lVar24 = lVar7;
      if (pdVar8[(uint)uVar11 & 0x7fffffff] * (double)(int)(((uint)uVar11 >> 0x1e & 2) - 1) <
          pdVar8[(uint)CVar6 & 0x7fffffff] * dVar31) {
        do {
          lVar25 = lVar24;
          *(int *)((long)&(begin._M_current)->field_0x0 + lVar25) = (int)uVar11;
          pCVar12 = begin._M_current;
          if (lVar25 == 4) goto LAB_0026654e;
          uVar14 = *(uint *)((long)&begin._M_current[-2].field_0x0 + lVar25);
          uVar11 = (ulong)uVar14;
          pdVar8 = ((comp.objective)->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          lVar24 = lVar25 + -4;
        } while ((double)(((int)uVar14 >> 0x1f) * -2 + -1) * pdVar8[uVar14 & 0x7fffffff] <
                 pdVar8[(uint)CVar6 & 0x7fffffff] * dVar31);
        pCVar12 = (CliqueVar *)((long)&begin._M_current[-1].field_0x0 + lVar25);
LAB_0026654e:
        *pCVar12 = CVar6;
        pdVar8 = ((comp.objective)->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start;
      }
      pCVar23 = pCVar19 + 1;
      lVar7 = lVar7 + 4;
      pCVar12 = pCVar19;
      pCVar19 = pCVar23;
    } while (pCVar23 != end._M_current);
  }
  return;
}

Assistant:

inline void pdqsort_loop(Iter begin, Iter end, Compare comp, int bad_allowed, bool leftmost = true) {
        typedef typename std::iterator_traits<Iter>::difference_type diff_t;

        // Use a while loop for tail recursion elimination.
        while (true) {
            diff_t size = end - begin;

            // Insertion sort is faster for small arrays.
            if (size < insertion_sort_threshold) {
                if (leftmost) insertion_sort(begin, end, comp);
                else unguarded_insertion_sort(begin, end, comp);
                return;
            }

            // Choose pivot as median of 3 or pseudomedian of 9.
            diff_t s2 = size / 2;
            if (size > ninther_threshold) {
                sort3(begin, begin + s2, end - 1, comp);
                sort3(begin + 1, begin + (s2 - 1), end - 2, comp);
                sort3(begin + 2, begin + (s2 + 1), end - 3, comp);
                sort3(begin + (s2 - 1), begin + s2, begin + (s2 + 1), comp);
                std::iter_swap(begin, begin + s2);
            } else sort3(begin + s2, begin, end - 1, comp);

            // If *(begin - 1) is the end of the right partition of a previous partition operation
            // there is no element in [begin, end) that is smaller than *(begin - 1). Then if our
            // pivot compares equal to *(begin - 1) we change strategy, putting equal elements in
            // the left partition, greater elements in the right partition. We do not have to
            // recurse on the left partition, since it's sorted (all equal).
            if (!leftmost && !comp(*(begin - 1), *begin)) {
                begin = partition_left(begin, end, comp) + 1;
                continue;
            }

            // Partition and get results.
            std::pair<Iter, bool> part_result =
                Branchless ? partition_right_branchless(begin, end, comp)
                           : partition_right(begin, end, comp);
            Iter pivot_pos = part_result.first;
            bool already_partitioned = part_result.second;

            // Check for a highly unbalanced partition.
            diff_t l_size = pivot_pos - begin;
            diff_t r_size = end - (pivot_pos + 1);
            bool highly_unbalanced = l_size < size / 8 || r_size < size / 8;

            // If we got a highly unbalanced partition we shuffle elements to break many patterns.
            if (highly_unbalanced) {
                // If we had too many bad partitions, switch to heapsort to guarantee O(n log n).
                if (--bad_allowed == 0) {
                    std::make_heap(begin, end, comp);
                    std::sort_heap(begin, end, comp);
                    return;
                }

                if (l_size >= insertion_sort_threshold) {
                    std::iter_swap(begin,             begin + l_size / 4);
                    std::iter_swap(pivot_pos - 1, pivot_pos - l_size / 4);

                    if (l_size > ninther_threshold) {
                        std::iter_swap(begin + 1,         begin + (l_size / 4 + 1));
                        std::iter_swap(begin + 2,         begin + (l_size / 4 + 2));
                        std::iter_swap(pivot_pos - 2, pivot_pos - (l_size / 4 + 1));
                        std::iter_swap(pivot_pos - 3, pivot_pos - (l_size / 4 + 2));
                    }
                }
                
                if (r_size >= insertion_sort_threshold) {
                    std::iter_swap(pivot_pos + 1, pivot_pos + (1 + r_size / 4));
                    std::iter_swap(end - 1,                   end - r_size / 4);
                    
                    if (r_size > ninther_threshold) {
                        std::iter_swap(pivot_pos + 2, pivot_pos + (2 + r_size / 4));
                        std::iter_swap(pivot_pos + 3, pivot_pos + (3 + r_size / 4));
                        std::iter_swap(end - 2,             end - (1 + r_size / 4));
                        std::iter_swap(end - 3,             end - (2 + r_size / 4));
                    }
                }
            } else {
                // If we were decently balanced and we tried to sort an already partitioned
                // sequence try to use insertion sort.
                if (already_partitioned && partial_insertion_sort(begin, pivot_pos, comp)
                                        && partial_insertion_sort(pivot_pos + 1, end, comp)) return;
            }
                
            // Sort the left partition first using recursion and do tail recursion elimination for
            // the right-hand partition.
            pdqsort_loop<Iter, Compare, Branchless>(begin, pivot_pos, comp, bad_allowed, leftmost);
            begin = pivot_pos + 1;
            leftmost = false;
        }
    }